

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O1

int WebPValidateDecoderConfig(WebPDecoderConfig *config)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int scaled_height;
  int scaled_width;
  int local_18;
  int local_14;
  uint uVar8;
  
  uVar7 = 0;
  uVar8 = 0;
  if ((((config != (WebPDecoderConfig *)0x0) &&
       (iVar6 = IsValidColorspace((config->output).colorspace), iVar6 != 0)) &&
      ((iVar6 = (config->options).use_cropping, iVar6 == 0 ||
       (((-1 < ((config->options).crop_top | (config->options).crop_left) &&
         (uVar7 = uVar8, 0 < (config->options).crop_width)) && (0 < (config->options).crop_height)))
       ))) && ((iVar1 = (config->options).use_scaling, iVar1 == 0 ||
               ((iVar2 = (config->options).scaled_width, uVar7 = uVar8, -1 < iVar2 &&
                (iVar3 = (config->options).scaled_height, (iVar2 != 0 || iVar3 != 0) && -1 < iVar3))
               )))) {
    iVar2 = (config->input).width;
    if ((0 < iVar2) || (0 < (config->input).height)) {
      _local_18 = CONCAT44((config->options).scaled_width,(config->options).scaled_height);
      if (iVar6 != 0) {
        uVar7 = (config->options).crop_left;
        uVar4 = (config->options).crop_top;
        if ((int)(uVar4 | uVar7) < 0) {
          return 0;
        }
        iVar6 = (config->options).crop_width;
        if (iVar6 < 1) {
          return 0;
        }
        iVar3 = (config->options).crop_height;
        if (iVar3 < 1) {
          return 0;
        }
        iVar5 = (config->input).height;
        if (((int)(iVar5 - uVar4) < iVar3 || (iVar5 < iVar3 || iVar5 <= (int)uVar4)) ||
            ((int)(iVar2 - uVar7) < iVar6 || (iVar2 < iVar6 || iVar2 <= (int)uVar7))) {
          return 0;
        }
      }
      if ((iVar1 != 0) &&
         (iVar6 = WebPRescalerGetScaledDimensions(iVar2,(config->input).height,&local_14,&local_18),
         iVar6 == 0)) {
        return 0;
      }
    }
    uVar7 = uVar8;
    if ((uint)(config->options).dithering_strength < 0x65) {
      uVar7 = (uint)((uint)(config->options).alpha_dithering_strength < 0x65);
    }
  }
  return uVar7;
}

Assistant:

int WebPValidateDecoderConfig(const WebPDecoderConfig* config) {
  const WebPDecoderOptions* options;
  if (config == NULL) return 0;
  if (!IsValidColorspace(config->output.colorspace)) {
    return 0;
  }

  options = &config->options;
  // bypass_filtering, no_fancy_upsampling, use_cropping, use_scaling,
  // use_threads, flip can be any integer and are interpreted as boolean.

  // Check for cropping.
  if (options->use_cropping && !WebPCheckCropDimensionsBasic(
                                   options->crop_left, options->crop_top,
                                   options->crop_width, options->crop_height)) {
    return 0;
  }
  // Check for scaling.
  if (options->use_scaling &&
      (options->scaled_width < 0 || options->scaled_height < 0 ||
       (options->scaled_width == 0 && options->scaled_height == 0))) {
    return 0;
  }

  // In case the WebPBitstreamFeatures has been filled in, check further.
  if (config->input.width > 0 || config->input.height > 0) {
    int scaled_width = options->scaled_width;
    int scaled_height = options->scaled_height;
    if (options->use_cropping &&
        !WebPCheckCropDimensions(config->input.width, config->input.height,
                                 options->crop_left, options->crop_top,
                                 options->crop_width, options->crop_height)) {
      return 0;
    }
    if (options->use_scaling && !WebPRescalerGetScaledDimensions(
                                    config->input.width, config->input.height,
                                    &scaled_width, &scaled_height)) {
      return 0;
    }
  }

  // Check for dithering.
  if (options->dithering_strength < 0 || options->dithering_strength > 100 ||
      options->alpha_dithering_strength < 0 ||
      options->alpha_dithering_strength > 100) {
    return 0;
  }

  return 1;
}